

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

RepeatedPtrFieldBase * __thiscall
google::protobuf::internal::MapFieldBase::SyncRepeatedFieldWithMap
          (MapFieldBase *this,bool for_mutation)

{
  State SVar1;
  ReflectionPayload *pRVar2;
  MutexLock lock;
  MutexLock local_20;
  
  SVar1 = state(this);
  if (SVar1 != STATE_MODIFIED_MAP) {
    pRVar2 = payload(this);
    return (RepeatedPtrFieldBase *)pRVar2;
  }
  pRVar2 = maybe_payload(this);
  if (pRVar2 == (ReflectionPayload *)0x0) {
    if ((!for_mutation) && ((int)this[1].super_MapFieldBaseForParse.payload_._M_i == 0)) {
      return (RepeatedPtrFieldBase *)&kZeroBuffer;
    }
    pRVar2 = payload(this);
  }
  local_20.mu_ = &pRVar2->mutex;
  absl::lts_20250127::Mutex::Lock(local_20.mu_);
  if ((pRVar2->state)._M_i == STATE_MODIFIED_MAP) {
    SyncRepeatedFieldWithMapNoLock(this);
    (pRVar2->state)._M_i = CLEAN;
  }
  absl::lts_20250127::MutexLock::~MutexLock(&local_20);
  return (RepeatedPtrFieldBase *)pRVar2;
}

Assistant:

const RepeatedPtrFieldBase& MapFieldBase::SyncRepeatedFieldWithMap(
    bool for_mutation) const {
  ConstAccess();
  if (state() == STATE_MODIFIED_MAP) {
    auto* p = maybe_payload();
    if (p == nullptr) {
      // If we have no payload, and we do not want to mutate the object, and the
      // map is empty, then do nothing.
      // This prevents modifying global default instances which might be in ro
      // memory.
      if (!for_mutation && GetMapRaw().empty()) {
        return *RawPtr<const RepeatedPtrFieldBase>();
      }
      p = &payload();
    }

    {
      absl::MutexLock lock(&p->mutex);
      // Double check state, because another thread may have seen the same
      // state and done the synchronization before the current thread.
      if (p->state.load(std::memory_order_relaxed) == STATE_MODIFIED_MAP) {
        const_cast<MapFieldBase*>(this)->SyncRepeatedFieldWithMapNoLock();
        p->state.store(CLEAN, std::memory_order_release);
      }
    }
    ConstAccess();
    return reinterpret_cast<const RepeatedPtrFieldBase&>(p->repeated_field);
  }
  return reinterpret_cast<const RepeatedPtrFieldBase&>(
      payload().repeated_field);
}